

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

bool dg::pta::PointerAnalysisFS::mergeMaps
               (MemoryMapT *mm,MemoryMapT *from,PointsToSetT *overwritten)

{
  bool bVar1;
  iterator this;
  iterator __k;
  reference ppVar2;
  bool bVar3;
  unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *toMo;
  PSNode *fromTarget;
  pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>
  *it;
  iterator __end2;
  iterator __begin2;
  MemoryMapT *__range2;
  bool changed;
  pointer in_stack_ffffffffffffff88;
  MemoryObject *in_stack_ffffffffffffff90;
  MemoryObject *this_00;
  
  bVar3 = false;
  this = std::
         map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
         ::begin((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                  *)in_stack_ffffffffffffff88);
  __k = std::
        map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
        ::end((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
               *)in_stack_ffffffffffffff88);
  while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffd0,(_Self *)&stack0xffffffffffffffc8
                                ), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
             ::operator*((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                          *)0x171e62);
    this_00 = (MemoryObject *)ppVar2->first;
    std::
    map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
    ::operator[]((map<dg::pta::PSNode_*,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::less<dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>_>
                  *)this._M_node,(key_type *)__k._M_node);
    bVar1 = std::operator==((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>
                             *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (bVar1) {
      operator_new(0x38);
      MemoryObject::MemoryObject(in_stack_ffffffffffffff90,(PSNode *)in_stack_ffffffffffffff88);
      std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::reset
                ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
                 in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::get
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               0x171ee5);
    std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>::get
              ((unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_> *)
               0x171ef8);
    bVar1 = mergeObjects((PSNode *)__end2._M_node,(MemoryObject *)it,(MemoryObject *)fromTarget,
                         (PointsToSetT *)toMo);
    bVar3 = bVar3 != false || bVar1;
    std::
    _Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<dg::pta::PSNode_*const,_std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
                  *)this_00);
    in_stack_ffffffffffffff90 = this_00;
  }
  return bVar3;
}

Assistant:

static bool mergeMaps(MemoryMapT *mm, MemoryMapT *from,
                          PointsToSetT *overwritten) {
        bool changed = false;
        for (auto &it : *from) {
            PSNode *fromTarget = it.first;
            std::unique_ptr<MemoryObject> &toMo = (*mm)[fromTarget];
            if (toMo == nullptr)
                toMo.reset(new MemoryObject(fromTarget));

            changed |= mergeObjects(fromTarget, toMo.get(), it.second.get(),
                                    overwritten);
        }

        return changed;
    }